

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void __thiscall
Chainstate::MaybeUpdateMempoolForReorg
          (Chainstate *this,DisconnectedBlockTransactions *disconnectpool,bool fAddToMempool)

{
  _List_node_base *p_Var1;
  CTxMemPool *pool;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  function<bool_(boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>)>
  check_final_and_mature;
  bool bVar5;
  bool bVar6;
  int64_t accept_time;
  CCoinsViewCache *coins_cache;
  uint256 *__args;
  _List_node_base *__return_storage_ptr__;
  long in_FS_OFFSET;
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  queuedTx;
  vector<uint256,_std::allocator<uint256>_> vHashUpdate;
  code *pcVar7;
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_170;
  vector<uint256,_std::allocator<uint256>_> local_158;
  GenTxid local_139;
  MempoolAcceptResult local_118;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_mempool != (CTxMemPool *)0x0) {
    local_158.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_158.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_finish = (uint256 *)0x0;
    local_158.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (uint256 *)0x0;
    __return_storage_ptr__ = (_List_node_base *)&local_170;
    DisconnectedBlockTransactions::take_abi_cxx11_
              ((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)__return_storage_ptr__,disconnectpool);
    if (__return_storage_ptr__ != local_170._M_impl._M_node.super__List_node_base._M_next) {
      do {
        bVar6 = true;
        if (fAddToMempool) {
          bVar5 = CTransaction::IsCoinBase
                            ((CTransaction *)__return_storage_ptr__->_M_prev[1]._M_next);
          if (bVar5) goto LAB_003f9bd8;
          p_Var1 = __return_storage_ptr__->_M_prev;
          accept_time = GetTime();
          AcceptToMemoryPool(&local_118,this,(CTransactionRef *)(p_Var1 + 1),accept_time,true,false)
          ;
          bVar6 = local_118.m_result_type != VALID;
          bVar5 = true;
        }
        else {
LAB_003f9bd8:
          bVar5 = false;
        }
        if (bVar5) {
          if (local_118.m_wtxids_fee_calculations.
              super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
              ._M_engaged == true) {
            local_118.m_wtxids_fee_calculations.
            super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
            ._M_engaged = false;
            if (local_118.m_wtxids_fee_calculations.
                super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                ._M_payload._M_value.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_118.m_wtxids_fee_calculations.
                              super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                              ._M_payload._M_value.
                              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_118.m_wtxids_fee_calculations.
                                    super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                                    ._M_payload._M_value.
                                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              local_118.m_wtxids_fee_calculations.
                              super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                              ._M_payload._0_8_);
            }
          }
          std::__cxx11::
          _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::_M_clear(&local_118.m_replaced_transactions.
                      super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.m_state.super_ValidationState<TxValidationResult>.m_debug_message.
                 _M_dataplus._M_p !=
              &local_118.m_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2)
          {
            operator_delete(local_118.m_state.super_ValidationState<TxValidationResult>.
                            m_debug_message._M_dataplus._M_p,
                            local_118.m_state.super_ValidationState<TxValidationResult>.
                            m_debug_message.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                 _M_dataplus._M_p !=
              &local_118.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2)
          {
            operator_delete(local_118.m_state.super_ValidationState<TxValidationResult>.
                            m_reject_reason._M_dataplus._M_p,
                            local_118.m_state.super_ValidationState<TxValidationResult>.
                            m_reject_reason.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar6) {
          CTxMemPool::removeRecursive
                    (this->m_mempool,(CTransaction *)__return_storage_ptr__->_M_prev[1]._M_next,
                     REORG);
        }
        else {
          p_Var1 = __return_storage_ptr__->_M_prev[1]._M_next;
          local_139.m_is_wtxid = false;
          local_139.m_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
               *(undefined8 *)((long)&p_Var1[3]._M_prev + 1);
          local_139.m_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
               *(undefined8 *)((long)&p_Var1[4]._M_next + 1);
          local_139.m_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
               *(undefined8 *)((long)&p_Var1[4]._M_prev + 1);
          local_139.m_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
               *(undefined8 *)((long)&p_Var1[5]._M_next + 1);
          bVar6 = CTxMemPool::exists(this->m_mempool,&local_139);
          if (bVar6) {
            p_Var1 = __return_storage_ptr__->_M_prev[1]._M_next;
            __args = (uint256 *)((long)&p_Var1[3]._M_prev + 1);
            if (local_158.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_158.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                        ((vector<uint256,std::allocator<uint256>> *)&local_158,
                         (iterator)
                         local_158.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                         super__Vector_impl_data._M_finish,__args);
            }
            else {
              uVar2 = *(undefined8 *)(__args->super_base_blob<256U>).m_data._M_elems;
              uVar3 = *(undefined8 *)((long)&p_Var1[4]._M_next + 1);
              uVar4 = *(undefined8 *)((long)&p_Var1[5]._M_next + 1);
              *(undefined8 *)
               (((local_158.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x10)
                   = *(undefined8 *)((long)&p_Var1[4]._M_prev + 1);
              *(undefined8 *)
               (((local_158.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x18)
                   = uVar4;
              *(undefined8 *)
               ((local_158.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems = uVar2;
              *(undefined8 *)
               (((local_158.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 8) =
                   uVar3;
              local_158.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_158.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
        }
        __return_storage_ptr__ = __return_storage_ptr__->_M_prev;
      } while (__return_storage_ptr__ != local_170._M_impl._M_node.super__List_node_base._M_next);
    }
    std::__cxx11::
    _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::_M_clear(&local_170);
    CTxMemPool::UpdateTransactionsFromBlock(this->m_mempool,&local_158);
    pcVar7 = std::
             _Function_handler<bool_(boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp:343:42)>
             ::_M_manager;
    check_final_and_mature.super__Function_base._M_functor._8_8_ = 0;
    check_final_and_mature.super__Function_base._M_functor._M_unused._M_object = this;
    check_final_and_mature.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp:343:42)>
         ::_M_manager;
    check_final_and_mature._M_invoker =
         std::
         _Function_handler<bool_(boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp:343:42)>
         ::_M_invoke;
    CTxMemPool::removeForReorg(this->m_mempool,&this->m_chain,check_final_and_mature);
    if (pcVar7 != (code *)0x0) {
      (*pcVar7)(&stack0xfffffffffffffe68,&stack0xfffffffffffffe68,3);
    }
    pool = this->m_mempool;
    coins_cache = CoinsTip(this);
    LimitMempoolSize(pool,coins_cache);
    if (local_158.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::MaybeUpdateMempoolForReorg(
    DisconnectedBlockTransactions& disconnectpool,
    bool fAddToMempool)
{
    if (!m_mempool) return;

    AssertLockHeld(cs_main);
    AssertLockHeld(m_mempool->cs);
    std::vector<uint256> vHashUpdate;
    {
        // disconnectpool is ordered so that the front is the most recently-confirmed
        // transaction (the last tx of the block at the tip) in the disconnected chain.
        // Iterate disconnectpool in reverse, so that we add transactions
        // back to the mempool starting with the earliest transaction that had
        // been previously seen in a block.
        const auto queuedTx = disconnectpool.take();
        auto it = queuedTx.rbegin();
        while (it != queuedTx.rend()) {
            // ignore validation errors in resurrected transactions
            if (!fAddToMempool || (*it)->IsCoinBase() ||
                AcceptToMemoryPool(*this, *it, GetTime(),
                    /*bypass_limits=*/true, /*test_accept=*/false).m_result_type !=
                        MempoolAcceptResult::ResultType::VALID) {
                // If the transaction doesn't make it in to the mempool, remove any
                // transactions that depend on it (which would now be orphans).
                m_mempool->removeRecursive(**it, MemPoolRemovalReason::REORG);
            } else if (m_mempool->exists(GenTxid::Txid((*it)->GetHash()))) {
                vHashUpdate.push_back((*it)->GetHash());
            }
            ++it;
        }
    }

    // AcceptToMemoryPool/addUnchecked all assume that new mempool entries have
    // no in-mempool children, which is generally not true when adding
    // previously-confirmed transactions back to the mempool.
    // UpdateTransactionsFromBlock finds descendants of any transactions in
    // the disconnectpool that were added back and cleans up the mempool state.
    m_mempool->UpdateTransactionsFromBlock(vHashUpdate);

    // Predicate to use for filtering transactions in removeForReorg.
    // Checks whether the transaction is still final and, if it spends a coinbase output, mature.
    // Also updates valid entries' cached LockPoints if needed.
    // If false, the tx is still valid and its lockpoints are updated.
    // If true, the tx would be invalid in the next block; remove this entry and all of its descendants.
    // Note that TRUC rules are not applied here, so reorgs may cause violations of TRUC inheritance or
    // topology restrictions.
    const auto filter_final_and_mature = [&](CTxMemPool::txiter it)
        EXCLUSIVE_LOCKS_REQUIRED(m_mempool->cs, ::cs_main) {
        AssertLockHeld(m_mempool->cs);
        AssertLockHeld(::cs_main);
        const CTransaction& tx = it->GetTx();

        // The transaction must be final.
        if (!CheckFinalTxAtTip(*Assert(m_chain.Tip()), tx)) return true;

        const LockPoints& lp = it->GetLockPoints();
        // CheckSequenceLocksAtTip checks if the transaction will be final in the next block to be
        // created on top of the new chain.
        if (TestLockPointValidity(m_chain, lp)) {
            if (!CheckSequenceLocksAtTip(m_chain.Tip(), lp)) {
                return true;
            }
        } else {
            const CCoinsViewMemPool view_mempool{&CoinsTip(), *m_mempool};
            const std::optional<LockPoints> new_lock_points{CalculateLockPointsAtTip(m_chain.Tip(), view_mempool, tx)};
            if (new_lock_points.has_value() && CheckSequenceLocksAtTip(m_chain.Tip(), *new_lock_points)) {
                // Now update the mempool entry lockpoints as well.
                it->UpdateLockPoints(*new_lock_points);
            } else {
                return true;
            }
        }

        // If the transaction spends any coinbase outputs, it must be mature.
        if (it->GetSpendsCoinbase()) {
            for (const CTxIn& txin : tx.vin) {
                if (m_mempool->exists(GenTxid::Txid(txin.prevout.hash))) continue;
                const Coin& coin{CoinsTip().AccessCoin(txin.prevout)};
                assert(!coin.IsSpent());
                const auto mempool_spend_height{m_chain.Tip()->nHeight + 1};
                if (coin.IsCoinBase() && mempool_spend_height - coin.nHeight < COINBASE_MATURITY) {
                    return true;
                }
            }
        }
        // Transaction is still valid and cached LockPoints are updated.
        return false;
    }